

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::
FormatString<char[36],char[25],unsigned_long,char[38],char_const*,char[25],unsigned_long,char[7]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [36],char (*Args_1) [25],
          unsigned_long *Args_2,char (*Args_3) [38],char **Args_4,char (*Args_5) [25],
          unsigned_long *Args_6,char (*Args_7) [7])

{
  stringstream local_1c8 [8];
  stringstream ss;
  char **Args_local_4;
  char (*Args_local_3) [38];
  unsigned_long *Args_local_2;
  char (*Args_local_1) [25];
  char (*Args_local) [36];
  
  std::__cxx11::stringstream::stringstream(local_1c8);
  FormatStrSS<std::__cxx11::stringstream,char[36],char[25],unsigned_long,char[38],char_const*,char[25],unsigned_long,char[7]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
             (char (*) [36])this,(char (*) [25])Args,(unsigned_long *)Args_1,(char (*) [38])Args_2,
             (char **)Args_3,(char (*) [25])Args_4,(unsigned_long *)Args_5,(char (*) [7])Args_6);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}